

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.hpp
# Opt level: O2

scalar_type
pico_tree::internal::
sum<double_const*,double_const*,double_const*,pico_tree::internal::squared_r1_distance_fn>
          (double *begin1,double *end1,double *begin2)

{
  scalar_type d;
  
  d = 0.0;
  for (; begin1 != end1; begin1 = begin1 + 1) {
    d = d + (*begin1 - *begin2) * (*begin1 - *begin2);
    begin2 = begin2 + 1;
  }
  return d;
}

Assistant:

constexpr auto sum(
    InputIterator1_ begin1,
    InputSentinel1_ end1,
    InputIterator2_ begin2,
    BinaryOperator op) {
  using scalar_type =
      typename std::iterator_traits<InputIterator1_>::value_type;

  scalar_type d{};

  for (; begin1 != end1; ++begin1, ++begin2) {
    d += op(*begin1, *begin2);
  }

  return d;
}